

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quota.h
# Opt level: O0

ssize_t quota_use(quota *quota,size_t size)

{
  uint64_t uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint64_t uVar6;
  uint64_t __e;
  uint64_t *__ep;
  uint64_t new_value;
  uint32_t new_used_in_units;
  uint32_t used_in_units;
  uint32_t total_in_units;
  uint64_t value;
  uint32_t size_in_units;
  size_t size_local;
  quota *quota_local;
  
  if (size < 0x3fffffffc01) {
    uVar5 = size + 0x3ff >> 10;
    iVar2 = (int)uVar5;
    if (iVar2 == 0) {
      __assert_fail("size_in_units",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                    ,0x89,"ssize_t quota_use(struct quota *, size_t)");
    }
    do {
      uVar1 = quota->value;
      uVar3 = (uint)(uVar1 >> 0x20);
      uVar4 = (uint)uVar1 + iVar2;
      if (uVar4 <= (uint)uVar1) {
        __assert_fail("new_used_in_units > used_in_units",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                      ,0x90,"ssize_t quota_use(struct quota *, size_t)");
      }
      if (uVar3 < uVar4) {
        return -1;
      }
      LOCK();
      uVar6 = quota->value;
      if (uVar1 == uVar6) {
        quota->value = CONCAT44(uVar3,uVar4);
        uVar6 = uVar1;
      }
      UNLOCK();
    } while (uVar6 != uVar1);
    quota_local = (quota *)((uVar5 & 0xffffffff) << 10);
  }
  else {
    quota_local = (quota *)0xffffffffffffffff;
  }
  return (ssize_t)quota_local;
}

Assistant:

static inline ssize_t
quota_use(struct quota *quota, size_t size)
{
	if (size > QUOTA_MAX)
		return -1;
	uint32_t size_in_units = (size + (QUOTA_UNIT_SIZE - 1))
				  / QUOTA_UNIT_SIZE;
	assert(size_in_units);
	while (1) {
		uint64_t value = quota->value;
		uint32_t total_in_units = value >> 32;
		uint32_t used_in_units = value & UINT32_MAX;

		uint32_t new_used_in_units = used_in_units + size_in_units;
		assert(new_used_in_units > used_in_units);

		if (new_used_in_units > total_in_units)
			return -1;

		uint64_t new_value =
			((uint64_t) total_in_units << 32) | new_used_in_units;

		if (pm_atomic_compare_exchange_weak(&quota->value, &value, new_value))
			break;
	}
	return size_in_units * QUOTA_UNIT_SIZE;
}